

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  size_type __n_00;
  char cVar1;
  char cVar2;
  value_type vVar3;
  value_type vVar4;
  reference pvVar5;
  idx_t pos_tgt;
  size_type sVar6;
  value_type vVar7;
  ulong uVar8;
  ulong uVar9;
  vector<unsigned_long,_true> distances1;
  vector<unsigned_long,_true> distances0;
  allocator_type local_b9;
  ulong local_b8;
  long local_b0;
  long local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  vector<unsigned_long,_true> local_88;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  value_type_conflict2 local_58;
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  
  local_48 = right.value._0_8_;
  local_50 = left.value._8_8_;
  local_38 = left.value._0_8_;
  local_b8 = local_50 & 0xffffffff;
  uVar9 = local_b8;
  if (((uint)fun.result != 0) && (uVar9 = (ulong)fun.result & 0xffffffff, left.value._8_4_ != 0)) {
    local_b0 = local_38;
    if ((uint)fun.result < 0xd) {
      local_b0 = (long)&local_40 + 4;
    }
    local_a8 = local_48;
    if (left.value._8_4_ < 0xd) {
      local_a8 = (long)&local_50 + 4;
    }
    __n = local_b8 + 1;
    local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_40 = fun.result;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,__n,
               (value_type_conflict2 *)&local_a0,(allocator_type *)&local_58);
    local_58 = 0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a0,__n,&local_58,
               &local_b9);
    sVar6 = 0;
    do {
      pvVar5 = vector<unsigned_long,_true>::operator[](&local_88,sVar6);
      *pvVar5 = sVar6;
      sVar6 = sVar6 + 1;
    } while (__n != sVar6);
    vVar7 = 0;
    local_70 = (ulong)fun.result & 0xffffffff;
    while (vVar7 != local_70) {
      pvVar5 = vector<unsigned_long,_true>::operator[]((vector<unsigned_long,_true> *)&local_a0,0);
      local_68 = vVar7 + 1;
      *pvVar5 = local_68;
      sVar6 = 0;
      local_60 = vVar7;
      do {
        __n_00 = sVar6 + 1;
        pvVar5 = vector<unsigned_long,_true>::operator[](&local_88,__n_00);
        vVar7 = *pvVar5;
        pvVar5 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_a0,sVar6);
        vVar3 = *pvVar5;
        pvVar5 = vector<unsigned_long,_true>::operator[](&local_88,sVar6);
        vVar4 = *pvVar5;
        cVar1 = *(char *)(local_b0 + local_60);
        cVar2 = *(char *)(local_a8 + sVar6);
        pvVar5 = vector<unsigned_long,_true>::operator[]
                           ((vector<unsigned_long,_true> *)&local_a0,__n_00);
        uVar8 = vVar4 + (cVar1 != cVar2);
        uVar9 = vVar3 + 1;
        if (uVar8 < vVar3 + 1) {
          uVar9 = uVar8;
        }
        if (vVar7 + 1 < uVar9) {
          uVar9 = vVar7 + 1;
        }
        *pvVar5 = uVar9;
        sVar6 = __n_00;
      } while (local_b8 != __n_00);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,&local_a0);
      vVar7 = local_68;
    }
    pvVar5 = vector<unsigned_long,_true>::operator[](&local_88,local_b8);
    local_b8 = *pvVar5;
    if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    uVar9 = local_b8;
    if (local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
      uVar9 = local_b8;
    }
  }
  local_b8 = uVar9;
  return local_b8;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}